

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node * lyd_insert_node_find_anchor(lyd_node *first_sibling,lyd_node *node)

{
  bool bVar1;
  lyd_node *local_28;
  lyd_node *anchor;
  lyd_node *node_local;
  lyd_node *first_sibling_local;
  
  if ((first_sibling == (lyd_node *)0x0) || ((first_sibling->flags & 8) == 0)) {
    local_28 = lyd_insert_get_next_anchor(first_sibling,node);
    if ((local_28 == (lyd_node *)0x0) &&
       (((node->schema != (lysc_node *)0x0 && (first_sibling != (lyd_node *)0x0)) &&
        (first_sibling->prev->schema == (lysc_node *)0x0)))) {
      local_28 = first_sibling->prev;
      while( true ) {
        bVar1 = false;
        if (local_28 != first_sibling) {
          bVar1 = local_28->prev->schema == (lysc_node *)0x0;
        }
        if (!bVar1) break;
        local_28 = local_28->prev;
      }
    }
    first_sibling_local = local_28;
  }
  else {
    first_sibling_local = (lyd_node *)0x0;
  }
  return first_sibling_local;
}

Assistant:

static struct lyd_node *
lyd_insert_node_find_anchor(struct lyd_node *first_sibling, struct lyd_node *node)
{
    struct lyd_node *anchor;

    if (first_sibling && (first_sibling->flags & LYD_EXT)) {
        return NULL;
    }

    /* find the anchor, so we can insert somewhere before it */
    anchor = lyd_insert_get_next_anchor(first_sibling, node);
    /* cannot insert data node after opaque nodes */
    if (!anchor && node->schema && first_sibling && !first_sibling->prev->schema) {
        anchor = first_sibling->prev;
        while ((anchor != first_sibling) && !anchor->prev->schema) {
            anchor = anchor->prev;
        }
    }

    return anchor;
}